

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.c
# Opt level: O3

void file_add(char *name)

{
  char *pcVar1;
  filetype_t fVar2;
  file_entry_s *pfVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  char cVar8;
  bool bVar9;
  
  pfVar3 = (file_entry_s *)mmalloc(0x18);
  pfVar3->next = (file_entry_s *)0x0;
  cur->next = pfVar3;
  cur = pfVar3;
  sVar4 = strlen(name);
  pcVar5 = (char *)mmalloc(sVar4 + 1);
  (pfVar3->file).name = pcVar5;
  strcpy(pcVar5,name);
  pcVar6 = (pfVar3->file).name;
  pcVar5 = pcVar6 + -1;
  lVar7 = 2;
  do {
    lVar7 = lVar7 + -1;
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar1 != '\0');
  if (lVar7 == 1) {
    cVar8 = *pcVar6;
  }
  else {
    do {
      cVar8 = pcVar5[-1];
      pcVar6 = pcVar5 + -1;
      if (cVar8 == '.') break;
      bVar9 = lVar7 != 0;
      pcVar5 = pcVar6;
      lVar7 = lVar7 + 1;
    } while (bVar9);
  }
  if (cVar8 == '.') {
    if (((pcVar6[1] == 'c') && (pcVar6[2] == '\0')) || ((pcVar6[1] == 'C' && (pcVar6[2] == '\0'))))
    {
      fVar2 = C;
      goto LAB_0010466e;
    }
    if (((pcVar6[1] == 'i') && (pcVar6[2] == '\0')) || ((pcVar6[1] == 'I' && (pcVar6[2] == '\0'))))
    {
      fVar2 = I;
      goto LAB_0010466e;
    }
    if (((pcVar6[1] == 's') && (pcVar6[2] == '\0')) || ((pcVar6[1] == 'S' && (pcVar6[2] == '\0'))))
    {
      fVar2 = S;
      goto LAB_0010466e;
    }
  }
  fVar2 = O;
LAB_0010466e:
  (pfVar3->file).type = fVar2;
  (pfVar3->file).tmp = 0;
  count = count + 1;
  return;
}

Assistant:

void file_add(const char* name)
{
    char* p;
    file_entry_t* nf = (file_entry_t*)mmalloc(sizeof(file_entry_t));
    nf->next = NULL;
    cur->next = nf;
    cur = cur->next;


    nf->file.name = (char*)mmalloc(strlen(name) + 1);
    strcpy(nf->file.name, name);
    p = nf->file.name;

    /* Find the file's type using its extension */
    while (*p)
        ++p;
    while (*p != '.' && p != nf->file.name)
        --p;

    if (strcmp(p, ".c") == 0 || strcmp(p, ".C") == 0)
        nf->file.type = C;
    else if (strcmp(p, ".i") == 0 || strcmp(p, ".I") == 0)
        nf->file.type = I;
    else if (strcmp(p, ".s") == 0 || strcmp(p, ".S") == 0)
        nf->file.type = S;
    else
        nf->file.type = O;

    nf->file.tmp = 0;
    ++count;
}